

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayStencilAttachments.cpp
# Opt level: O3

void __thiscall
glcts::TextureCubeMapArrayStencilAttachments::initTestIteration
          (TextureCubeMapArrayStencilAttachments *this,GLuint test_index)

{
  int iVar1;
  deUint32 dVar2;
  GLenum framebuffer_status;
  undefined4 extraout_var;
  TextureCubeMapArrayStencilAttachments *this_00;
  long lVar3;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x6f8))(1,&this->m_texture_cube_array_color_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not generate texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x2fd);
  (**(code **)(lVar3 + 0xb8))(0x9009,this->m_texture_cube_array_color_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not bind a texture object to GL_TEXTURE_CUBE_MAP_ARRAY_EXT target",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x300);
  if (this->m_immutable_storage == '\0') {
    createMutableCubeArrayColor(this,test_index);
  }
  else {
    createImmutableCubeArrayColor(this,test_index);
  }
  (**(code **)(lVar3 + 0x6f8))(1,&this->m_texture_cube_array_stencil_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not generate texture object!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x30d);
  (**(code **)(lVar3 + 0xb8))(0x9009,this->m_texture_cube_array_stencil_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not bind texture object to GL_TEXTURE_CUBE_MAP_ARRAY_EXT target",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x310);
  if (this->m_immutable_storage == '\0') {
    createMutableCubeArrayStencil(this,test_index);
  }
  else {
    createImmutableCubeArrayStencil(this,test_index);
  }
  (**(code **)(lVar3 + 0x78))(0x8ca9,this->m_fbo_draw_id);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not bind draw framebuffer!",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,0x31d);
  (**(code **)(lVar3 + 0x1a00))
            (0,0,this->m_cube_map_array_data[test_index].m_width,
             this->m_cube_map_array_data[test_index].m_height);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"Could not set viewport",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayStencilAttachments.cpp"
                  ,800);
  if (this->m_fbo_layered == '\0') {
    setupNonLayeredFramebuffer(this);
  }
  else {
    setupLayeredFramebuffer(this);
  }
  this_00 = (TextureCubeMapArrayStencilAttachments *)0x8ca9;
  framebuffer_status = (**(code **)(lVar3 + 0x170))();
  checkFramebufferStatus(this_00,framebuffer_status);
  return;
}

Assistant:

void TextureCubeMapArrayStencilAttachments::initTestIteration(glw::GLuint test_index)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up texture storage for color data */
	gl.genTextures(1, &m_texture_cube_array_color_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate texture object!");

	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_texture_cube_array_color_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind a texture object to GL_TEXTURE_CUBE_MAP_ARRAY_EXT target");

	if (m_immutable_storage)
	{
		createImmutableCubeArrayColor(test_index);
	}
	else
	{
		createMutableCubeArrayColor(test_index);
	}

	/* Set up texture storage for stencil data */
	gl.genTextures(1, &m_texture_cube_array_stencil_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate texture object!");

	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_texture_cube_array_stencil_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind texture object to GL_TEXTURE_CUBE_MAP_ARRAY_EXT target");

	if (m_immutable_storage)
	{
		createImmutableCubeArrayStencil(test_index);
	}
	else
	{
		createMutableCubeArrayStencil(test_index);
	}

	/* Set up the draw framebuffer */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_draw_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not bind draw framebuffer!");

	gl.viewport(0, 0, m_cube_map_array_data[test_index].getWidth(), m_cube_map_array_data[test_index].getHeight());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not set viewport");

	if (m_fbo_layered)
	{
		setupLayeredFramebuffer();
	}
	else
	{
		setupNonLayeredFramebuffer();
	}

	/* Is the draw FBO complete, now that we're done with configuring it? */
	checkFramebufferStatus(gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER));
}